

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O3

int helicsDataBufferVectorSize(HelicsDataBuffer data)

{
  DataType DVar1;
  Message *pMVar2;
  size_t sVar3;
  SmallBuffer *ptr;
  ulong uVar4;
  vector<double,_std::allocator<double>_> v;
  vector<double,_std::allocator<double>_> local_48;
  data_view local_30;
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar2 = getMessageObj(data,(HelicsError *)0x0);
    if (pMVar2 == (Message *)0x0) {
      return 0;
    }
    data = &pMVar2->data;
  }
  DVar1 = helics::detail::detectType(((SmallBuffer *)data)->heap);
  if ((uint)DVar1 < 8) {
    if ((0x86U >> (DVar1 & (HELICS_JSON|HELICS_DOUBLE)) & 1) != 0) {
      return 1;
    }
    if ((0x30U >> (DVar1 & (HELICS_JSON|HELICS_DOUBLE)) & 1) != 0) {
      sVar3 = helics::detail::getDataSize(((SmallBuffer *)data)->heap);
      return (int)sVar3;
    }
    if (DVar1 == HELICS_COMPLEX) {
      return 2;
    }
  }
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_30.dblock._M_len = ((SmallBuffer *)data)->bufferSize;
  local_30.dblock._M_str = (char *)((SmallBuffer *)data)->heap;
  local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  DVar1 = helics::detail::detectType((byte *)local_30.dblock._M_str);
  helics::valueExtract(&local_30,DVar1,&local_48);
  if (local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  uVar4 = (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (int)(uVar4 >> 3);
}

Assistant:

int helicsDataBufferVectorSize(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    switch (helics::detail::detectType(ptr->data())) {
        case helics::DataType::HELICS_VECTOR:
        case helics::DataType::HELICS_COMPLEX_VECTOR:
            return static_cast<int>(helics::detail::getDataSize(ptr->data()));
        case helics::DataType::HELICS_BOOL:
        case helics::DataType::HELICS_INT:
        case helics::DataType::HELICS_DOUBLE:
            return 1;
        case helics::DataType::HELICS_COMPLEX:
            return 2;
        default: {
            std::vector<double> v;
            helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);
            return static_cast<int>(v.size());
        } break;
    }
}